

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O2

void __thiscall
SimpleStringInternalCache::releaseCachedBlockFrom
          (SimpleStringInternalCache *this,char *memory,SimpleStringInternalCacheNode *node)

{
  UtestShell *pUVar1;
  char *pcVar2;
  SimpleStringMemoryBlock *block;
  SimpleStringMemoryBlock *pSVar3;
  SimpleStringMemoryBlock *pSVar4;
  SimpleString SStack_28;
  
  pSVar4 = node->usedMemoryHead_;
  if ((pSVar4 == (SimpleStringMemoryBlock *)0x0) || (pSVar4->memory_ != memory)) {
    do {
      pSVar3 = pSVar4;
      if (pSVar3 == (SimpleStringMemoryBlock *)0x0) {
        if (this->hasWarnedAboutDeallocations == false) {
          this->hasWarnedAboutDeallocations = true;
          pUVar1 = UtestShell::getCurrent();
          StringFromFormat((char *)&SStack_28,
                           "\nWARNING: Attempting to deallocate a String buffer that was allocated while not caching. Ignoring it!\nThis is likely due statics and will cause problems.\nOnly warning once to avoid recursive warnings.\nString we are deallocating: \"%s\"\n"
                           ,memory);
          pcVar2 = SimpleString::asCharString(&SStack_28);
          (*pUVar1->_vptr_UtestShell[0x1c])
                    (pUVar1,pcVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x9e);
          SimpleString::~SimpleString(&SStack_28);
        }
        return;
      }
      pSVar4 = pSVar3->next_;
    } while ((pSVar4 == (SimpleStringMemoryBlock *)0x0) || (pSVar4->memory_ != memory));
    pSVar3->next_ = pSVar4->next_;
  }
  else {
    node->usedMemoryHead_ = pSVar4->next_;
  }
  pSVar4->next_ = node->freeMemoryHead_;
  node->freeMemoryHead_ = pSVar4;
  return;
}

Assistant:

void SimpleStringInternalCache::releaseCachedBlockFrom(char* memory, SimpleStringInternalCacheNode* node)
{
    if (node->usedMemoryHead_ && node->usedMemoryHead_->memory_ == memory) {
        SimpleStringMemoryBlock* block = node->usedMemoryHead_;
        node->usedMemoryHead_ = node->usedMemoryHead_->next_;
        node->freeMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->freeMemoryHead_);
        return;
    }

    for (SimpleStringMemoryBlock* block = node->usedMemoryHead_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            node->freeMemoryHead_ = addToSimpleStringMemoryBlockList(blockToFree, node->freeMemoryHead_);
            return;
        }
    }
    printDeallocatingUnknownMemory(memory);

}